

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

int __thiscall testing::TestCase::reportable_test_count(TestCase *this)

{
  int iVar1;
  TestCase *this_local;
  
  iVar1 = internal::
          CountIf<std::vector<testing::TestInfo*,std::allocator<testing::TestInfo*>>,bool(*)(testing::TestInfo_const*)>
                    (&this->test_info_list_,TestReportable);
  return iVar1;
}

Assistant:

int TestCase::reportable_test_count() const {
  return CountIf(test_info_list_, TestReportable);
}